

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

bool libtorrent::anon_unknown_1::filter_path_character(int32_t c)

{
  const_iterator pvVar1;
  const_iterator __last;
  int *piVar2;
  char *pcVar3;
  int32_t local_10;
  bool local_9;
  int32_t c_local;
  
  local_10 = c;
  pvVar1 = ::std::array<int,_7UL>::begin(&filter_path_character::bad_cp);
  __last = ::std::array<int,_7UL>::end(&filter_path_character::bad_cp);
  piVar2 = ::std::find<int_const*,int>(pvVar1,__last,&local_10);
  pvVar1 = ::std::array<int,_7UL>::end(&filter_path_character::bad_cp);
  if (piVar2 == pvVar1) {
    if (local_10 < 0x80) {
      pcVar3 = strchr("/\\",(int)(char)local_10);
      local_9 = pcVar3 != (char *)0x0;
    }
    else {
      local_9 = false;
    }
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool filter_path_character(std::int32_t const c)
	{
		// these unicode characters change the writing direction of the
		// string and can be used for attacks:
		// https://security.stackexchange.com/questions/158802/how-can-this-executable-have-an-avi-extension
		static const std::array<std::int32_t, 7> bad_cp = {{0x202a, 0x202b, 0x202c, 0x202d, 0x202e, 0x200e, 0x200f}};
		if (std::find(bad_cp.begin(), bad_cp.end(), c) != bad_cp.end()) return true;

		static const char invalid_chars[] = "/\\";
		if (c > 127) return false;
		return std::strchr(invalid_chars, static_cast<char>(c)) != nullptr;
	}